

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serv.cpp
# Opt level: O1

UnicodeString * __thiscall
icu_63::ICUService::getDisplayName
          (ICUService *this,UnicodeString *id,UnicodeString *result,Locale *locale)

{
  char cVar1;
  int iVar2;
  Hashtable *pHVar3;
  long *plVar4;
  undefined4 extraout_var;
  long *plVar5;
  bool bVar6;
  UErrorCode status;
  UnicodeString us;
  UErrorCode local_7c;
  Locale *local_78;
  UnicodeString local_70;
  
  local_7c = U_ZERO_ERROR;
  local_78 = locale;
  umtx_lock_63((UMutex *)lock);
  pHVar3 = getVisibleIDMap(this,&local_7c);
  bVar6 = true;
  if (pHVar3 != (Hashtable *)0x0) {
    plVar4 = (long *)uhash_get_63(pHVar3->hash,id);
    if (plVar4 == (long *)0x0) {
      local_7c = U_ZERO_ERROR;
      iVar2 = (*(this->super_ICUNotifier)._vptr_ICUNotifier[0xd])(this,id);
      plVar4 = (long *)CONCAT44(extraout_var,iVar2);
      bVar6 = plVar4 == (long *)0x0;
      do {
        if (plVar4 == (long *)0x0) break;
        cVar1 = (**(code **)(*plVar4 + 0x38))(plVar4);
        if (cVar1 == '\0') {
          (**(code **)(*plVar4 + 8))(plVar4);
          bVar6 = true;
          break;
        }
        local_70.super_Replaceable.super_UObject._vptr_UObject =
             (UObject)&PTR__UnicodeString_00401be0;
        local_70.fUnion.fStackFields.fLengthAndFlags = 2;
        (**(code **)(*plVar4 + 0x28))(plVar4,&local_70);
        plVar5 = (long *)uhash_get_63(pHVar3->hash,&local_70);
        if (plVar5 != (long *)0x0) {
          (**(code **)(*plVar5 + 0x28))(plVar5,id,local_78,result);
          (**(code **)(*plVar4 + 8))(plVar4);
        }
        UnicodeString::~UnicodeString(&local_70);
      } while (plVar5 == (long *)0x0);
    }
    else {
      (**(code **)(*plVar4 + 0x28))(plVar4,id,local_78,result);
      bVar6 = false;
    }
  }
  umtx_unlock_63((UMutex *)lock);
  if (bVar6) {
    UnicodeString::setToBogus(result);
  }
  return result;
}

Assistant:

UnicodeString& 
ICUService::getDisplayName(const UnicodeString& id, UnicodeString& result, const Locale& locale) const 
{
    {
        UErrorCode status = U_ZERO_ERROR;
        Mutex mutex(&lock);
        const Hashtable* map = getVisibleIDMap(status);
        if (map != NULL) {
            ICUServiceFactory* f = (ICUServiceFactory*)map->get(id);
            if (f != NULL) {
                f->getDisplayName(id, locale, result);
                return result;
            }

            // fallback
            status = U_ZERO_ERROR;
            ICUServiceKey* fallbackKey = createKey(&id, status);
            while (fallbackKey != NULL && fallbackKey->fallback()) {
                UnicodeString us;
                fallbackKey->currentID(us);
                f = (ICUServiceFactory*)map->get(us);
                if (f != NULL) {
                    f->getDisplayName(id, locale, result);
                    delete fallbackKey;
                    return result;
                }
            }
            delete fallbackKey;
        }
    }
    result.setToBogus();
    return result;
}